

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_uint stb_decompress(stb_uchar *output,stb_uchar *i,stb_uint length)

{
  stb_uint buflen;
  stb_uint sVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ushort *puVar6;
  ushort *puVar7;
  uchar *puVar8;
  
  uVar5 = *(uint *)i;
  if (((uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) !=
       0x57bc0000) ||
     (uVar5 = *(uint *)(i + 4),
     ((uVar5 >> 0x18 != 0 || (uVar5 & 0xff0000) != 0) || (uVar5 & 0xff00) != 0) ||
     (uVar5 & 0xff) != 0)) {
    return 0;
  }
  buflen = stb_decompress_length(i);
  stb__barrier3 = i + length;
  puVar8 = output + buflen;
  puVar6 = (ushort *)(i + 0x10);
  stb__barrier2 = i;
  stb__barrier = puVar8;
  stb__barrier4 = output;
  stb__dout = output;
  do {
    bVar4 = (byte)*puVar6;
    uVar5 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (bVar4 < 0x18) {
        if (bVar4 < 0x10) {
          if (bVar4 < 8) {
            if (bVar4 == 4) {
              stb__match(stb__dout +
                         ~((ulong)*(byte *)((long)puVar6 + 3) |
                           (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8)
                         ,(ushort)(puVar6[2] << 8 | puVar6[2] >> 8) + 1);
              puVar7 = puVar6 + 3;
              goto LAB_001559eb;
            }
            if (uVar5 == 6) {
              uVar3 = ~((ulong)*(byte *)((long)puVar6 + 3) |
                        (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8);
              uVar5 = (uint)(byte)puVar6[2];
              goto LAB_00155928;
            }
            if (uVar5 != 7) goto LAB_00155a6e;
            stb__lit((byte *)((long)puVar6 + 3),
                     (ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                             *(ushort *)((long)puVar6 + 1) >> 8) + 1);
            uVar3 = (ulong)(ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                   *(ushort *)((long)puVar6 + 1) >> 8);
            lVar2 = 4;
          }
          else {
            stb__lit((stb_uchar *)(puVar6 + 1),
                     ((uint)bVar4 * 0x100 + (uint)*(byte *)((long)puVar6 + 1)) - 0x7ff);
            uVar3 = (ulong)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
            lVar2 = -0x7fd;
          }
LAB_001559dc:
          puVar7 = (ushort *)((long)puVar6 + uVar3 + lVar2);
          if (puVar7 == puVar6) {
            bVar4 = (byte)*puVar6;
LAB_00155a6e:
            if ((bVar4 != 5) || (*(byte *)((long)puVar6 + 1) != 0xfa)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x27fb,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
            }
            if (stb__dout != puVar8) {
              __assert_fail("stb__dout == output + olen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x27f5,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
            }
            sVar1 = stb_adler32(1,output,buflen);
            uVar5 = *(uint *)(puVar6 + 1);
            if (sVar1 != (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18)) {
              return 0;
            }
            return buflen;
          }
        }
        else {
          uVar3 = -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                           ((uint)(byte)puVar6[1] | (uint)bVar4 << 0x10)) - 0xfffff);
          uVar5 = (uint)(ushort)(*(ushort *)((long)puVar6 + 3) << 8 |
                                *(ushort *)((long)puVar6 + 3) >> 8);
LAB_00155928:
          stb__match(stb__dout + uVar3,uVar5 + 1);
          puVar7 = (ushort *)((long)puVar6 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                            ((uint)(byte)puVar6[1] | (uint)bVar4 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar6 + 3) + 1);
        puVar7 = puVar6 + 2;
      }
    }
    else if ((char)bVar4 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar6 + 1),uVar5 - 0x7f);
      puVar7 = puVar6 + 1;
    }
    else {
      if (bVar4 < 0x40) {
        stb__lit((byte *)((long)puVar6 + 1),uVar5 - 0x1f);
        uVar3 = (ulong)(byte)*puVar6;
        lVar2 = -0x1e;
        goto LAB_001559dc;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar6 + 1) + (uint)bVar4 * 0x100) - 0x3fff),
                 (byte)puVar6[1] + 1);
      puVar7 = (ushort *)((long)puVar6 + 3);
    }
LAB_001559eb:
    puVar6 = puVar7;
    if (puVar8 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x27ff,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
    }
  } while( true );
}

Assistant:

stb_uint stb_decompress(stb_uchar *output, stb_uchar *i, stb_uint length)
{
   stb_uint olen;
   if (stb__in4(0) != 0x57bC0000) return 0;
   if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
   olen = stb_decompress_length(i);
   stb__barrier2 = i;
   stb__barrier3 = i+length;
   stb__barrier = output + olen;
   stb__barrier4 = output;
   i += 16;

   stb__dout = output;
   while (1) {
      stb_uchar *old_i = i;
      i = stb_decompress_token(i);
      if (i == old_i) {
         if (*i == 0x05 && i[1] == 0xfa) {
            assert(stb__dout == output + olen);
            if (stb__dout != output + olen) return 0;
            if (stb_adler32(1, output, olen) != (stb_uint) stb__in4(2))
               return 0;
            return olen;
         } else {
            assert(0); /* NOTREACHED */
            return 0;
         }
      }
      assert(stb__dout <= output + olen); 
      if (stb__dout > output + olen)
         return 0;
   }
}